

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O1

uint16_t wirehair::NextPrime16(uint16_t n)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong in_R11;
  ulong uVar5;
  
  if (n < 8) {
    uVar2 = *(uint16_t *)(&DAT_0010df80 + (ulong)n * 2);
  }
  else if (n < 0xfff2) {
    uVar3 = (uint)n;
    uVar10 = (uVar3 + 1 + (n / 0xd2) * -0xd2 & 0xffff) +
             (uint)(byte)kSieveTable[uVar3 + (n / 0xd2) * -0xd2 & 0xffff];
    uVar3 = (byte)kSieveTable[uVar3 + (n / 0xd2) * -0xd2 & 0xffff] + uVar3;
    uVar5 = (ulong)uVar3;
    uVar6 = uVar3 & 0xffff;
    uVar9 = 6;
    if (0xff < (ushort)uVar3) {
      uVar9 = LZCOUNT(uVar6) ^ 0x1f;
    }
    uVar9 = (uint)((byte)kSquareRootTable[uVar6 >> ((ulong)((char)uVar9 - 6U & 0xfe) & 0x3f)] >>
                  ((byte)(uVar9 >> 1) ^ 7));
    uVar9 = uVar9 - (uVar6 < uVar9 * uVar9) & 0xffff;
    uVar3 = uVar9 * uVar9;
    lVar7 = 0;
LAB_0010a1bb:
    do {
      iVar8 = 0;
      if (uVar9 < (byte)(&kPrimesUnder256From11)[lVar7]) {
        iVar8 = 1;
        bVar1 = false;
        in_R11 = uVar5;
      }
      else {
        bVar1 = true;
        if ((int)((uVar5 & 0xffff) % (ulong)(uint)(byte)(&kPrimesUnder256From11)[lVar7]) == 0) {
          uVar6 = uVar10 - 0xd2;
          if (uVar10 < 0xd2) {
            uVar6 = uVar10;
          }
          uVar10 = (byte)kSieveTable[uVar6] + 1 + uVar6;
          uVar4 = (int)uVar5 + 1 + (uint)(byte)kSieveTable[uVar6];
          uVar5 = (ulong)uVar4;
          uVar6 = uVar9 + 1;
          if (uVar3 < (uVar4 & 0xffff)) {
            uVar3 = uVar6 * uVar6;
            uVar9 = uVar6;
          }
          iVar8 = 7;
          bVar1 = false;
        }
      }
      uVar2 = (uint16_t)uVar5;
      if (bVar1) {
        lVar7 = lVar7 + 1;
        if (lVar7 != 0x32) goto LAB_0010a1bb;
        iVar8 = 8;
      }
      lVar7 = 0;
    } while (iVar8 == 7);
    if (iVar8 != 8) {
      uVar2 = (uint16_t)in_R11;
    }
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint16_t NextPrime16(uint16_t n)
{
    // Handle small n
    switch (n)
    {
    case 0:
        CAT_DEBUG_BREAK(); // Invalid input
    case 1: return 1;
    case 2: return 2;
    case 3: return 3;
    case 4:
    case 5: return 5;
    case 6:
    case 7: return 7;
    }

    // Handle large n
    if (n > 65521) {
        CAT_DEBUG_BREAK(); // Invalid input
        return 0;
    }

    // Choose first n from table
    unsigned offset = n % kSieveTableSize;
    uint16_t next = kSieveTable[offset];
    offset += next + 1;
    n += next;

    // Initialize p_max to floor(sqrt(n))
    unsigned p_max = FloorSquareRoot16(n);
    unsigned p_max2 = p_max * p_max;
    const uint8_t * GF256_RESTRICT primes = &kPrimesUnder256From11[0];

    // For each number to try:
TryNext:

    // For each prime to test up to square root:
    for (unsigned i = 0; i < kPrimesUnder256Count; ++i)
    {
        // If the next prime is above p_max we are done!
        const uint8_t p = primes[i];
        if (p > p_max) {
            return n;
        }

        // If composite, try next n
        if (n % p == 0)
        {
            // Use table to choose next trial number
            if (offset >= kSieveTableSize) {
                offset -= kSieveTableSize;
            }

            // Get next to test
            next = kSieveTable[offset];
            offset += next + 1;
            n += next + 1;

            // Derivative square root iteration of p_max
            if (p_max2 < n)
            {
                ++p_max;
                p_max2 = p_max * p_max;
            }

            goto TryNext;
        }
    }

    return n;
}